

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O0

void __thiscall deci::dictionary_t::Insert(dictionary_t *this,dictionary_t *src)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  undefined4 extraout_var;
  pointer ppVar4;
  undefined4 extraout_var_00;
  value_t *local_70;
  value_t *local_68;
  pair<deci::value_t_*,_deci::value_t_*> local_60;
  _Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true> local_50;
  _Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true> local_48;
  iterator it;
  value_type el;
  const_iterator __end1;
  const_iterator __begin1;
  storage_t *__range1;
  dictionary_t *src_local;
  dictionary_t *this_local;
  
  __end1 = std::
           unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
           ::begin(&src->storage);
  el.second = (value_t *)
              std::
              unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
              ::end(&src->storage);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                       ,(_Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                         *)&el.second);
    if (!bVar1) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::
             operator*(&__end1);
    it.super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>._M_cur =
         (_Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>)pvVar3->first;
    el.first = pvVar3->second;
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
         ::find(&this->storage,(key_type *)&it);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
         ::end(&this->storage);
    bVar1 = std::__detail::operator==(&local_48,&local_50);
    if (bVar1) {
      local_68 = (value_t *)
                 (**(code **)(*(long *)it.
                                       super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                                       ._M_cur + 0x10))();
      iVar2 = (*(el.first)->_vptr_value_t[2])();
      local_70 = (value_t *)CONCAT44(extraout_var,iVar2);
      local_60 = std::make_pair<deci::value_t*,deci::value_t*>(&local_68,&local_70);
      std::
      unordered_map<deci::value_t*,deci::value_t*,deci::value_hash_t,deci::value_equal_to_t,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>>
      ::insert<std::pair<deci::value_t*,deci::value_t*>>
                ((unordered_map<deci::value_t*,deci::value_t*,deci::value_hash_t,deci::value_equal_to_t,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>>
                  *)&this->storage,&local_60);
    }
    else {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::
               operator->((_Node_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>
                           *)&local_48);
      (*ppVar4->second->_vptr_value_t[3])();
      iVar2 = (*(el.first)->_vptr_value_t[2])();
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::
               operator->((_Node_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>
                           *)&local_48);
      ppVar4->second = (value_t *)CONCAT44(extraout_var_00,iVar2);
    }
    std::__detail::
    _Node_const_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void dictionary_t::Insert(const dictionary_t& src) {
    for (auto el: src.storage) {
      storage_t::iterator it = this->storage.find(el.first);
      if (it == this->storage.end())
      {
        this->storage.insert(std::make_pair(el.first->Copy(), el.second->Copy()));
      }
      else
      {
        it->second->Delete();
        it->second = el.second->Copy();
      }
    }
  }